

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::ValidateMapEntry
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Label LVar5;
  Type TVar6;
  Descriptor *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  FieldDescriptor *this_01;
  FieldDescriptor *this_02;
  EnumDescriptor *this_03;
  EnumValueDescriptor *this_04;
  FieldDescriptor *in_RSI;
  FieldDescriptor *value;
  FieldDescriptor *key;
  Descriptor *message;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  uint uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  bool local_91;
  undefined1 in_stack_ffffffffffffff87;
  string *in_stack_ffffffffffffff88;
  string local_68 [8];
  char *in_stack_ffffffffffffffa0;
  ErrorLocation in_stack_ffffffffffffffac;
  Message *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  DescriptorBuilder *in_stack_ffffffffffffffc0;
  
  this_00 = FieldDescriptor::message_type((FieldDescriptor *)in_stack_ffffffffffffff40);
  iVar4 = Descriptor::extension_count(this_00);
  bVar1 = false;
  bVar3 = false;
  local_91 = true;
  if (iVar4 == 0) {
    LVar5 = FieldDescriptor::label(in_RSI);
    local_91 = true;
    if (LVar5 == LABEL_REPEATED) {
      iVar4 = Descriptor::extension_range_count(this_00);
      local_91 = true;
      if (iVar4 == 0) {
        iVar4 = Descriptor::nested_type_count(this_00);
        local_91 = true;
        if (iVar4 == 0) {
          iVar4 = Descriptor::enum_type_count(this_00);
          local_91 = true;
          if (iVar4 == 0) {
            iVar4 = Descriptor::field_count(this_00);
            local_91 = true;
            if (iVar4 == 2) {
              in_stack_ffffffffffffff50 = Descriptor::name_abi_cxx11_(this_00);
              FieldDescriptor::name_abi_cxx11_(in_RSI);
              anon_unknown_1::ToCamelCase(in_stack_ffffffffffffff88,(bool)in_stack_ffffffffffffff87)
              ;
              bVar1 = true;
              std::operator+(in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40);
              bVar3 = true;
              bVar2 = std::operator!=(in_stack_ffffffffffffff40,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_ffffffffffffff3c,
                                                  in_stack_ffffffffffffff38));
              local_91 = true;
              if (!bVar2) {
                pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         FieldDescriptor::containing_type(in_RSI);
                in_stack_ffffffffffffff40 =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Descriptor::containing_type(this_00);
                local_91 = pbVar7 != in_stack_ffffffffffffff40;
              }
            }
          }
        }
      }
    }
  }
  uVar8 = CONCAT13(local_91,(int3)in_stack_ffffffffffffff3c);
  if (bVar3) {
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  }
  if (bVar1) {
    std::__cxx11::string::~string(local_68);
  }
  if ((uVar8 & 0x1000000) != 0) {
    return false;
  }
  this_01 = Descriptor::field(this_00,0);
  this_02 = Descriptor::field(this_00,1);
  LVar5 = FieldDescriptor::label(this_01);
  if ((LVar5 != LABEL_OPTIONAL) || (iVar4 = FieldDescriptor::number(this_01), iVar4 != 1)) {
    return false;
  }
  FieldDescriptor::name_abi_cxx11_(this_01);
  bVar3 = std::operator!=(in_stack_ffffffffffffff40,
                          (char *)CONCAT44(uVar8,in_stack_ffffffffffffff38));
  if (bVar3) {
    return false;
  }
  LVar5 = FieldDescriptor::label(this_02);
  if ((LVar5 != LABEL_OPTIONAL) || (iVar4 = FieldDescriptor::number(this_02), iVar4 != 2)) {
    return false;
  }
  FieldDescriptor::name_abi_cxx11_(this_02);
  bVar3 = std::operator!=(in_stack_ffffffffffffff40,
                          (char *)CONCAT44(uVar8,in_stack_ffffffffffffff38));
  if (bVar3) {
    return false;
  }
  TVar6 = FieldDescriptor::type((FieldDescriptor *)in_stack_ffffffffffffff50);
  if (1 < TVar6 - TYPE_DOUBLE) {
    if (TVar6 - TYPE_INT64 < 7) goto LAB_004c9c12;
    if (2 < TVar6 - TYPE_GROUP) {
      if ((TVar6 != TYPE_UINT32) && (TVar6 == TYPE_ENUM)) {
        FieldDescriptor::full_name_abi_cxx11_(in_RSI);
        AddError(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                 in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
      }
      goto LAB_004c9c12;
    }
  }
  FieldDescriptor::full_name_abi_cxx11_(in_RSI);
  AddError(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
           in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
LAB_004c9c12:
  TVar6 = FieldDescriptor::type((FieldDescriptor *)in_stack_ffffffffffffff50);
  if (TVar6 == TYPE_ENUM) {
    this_03 = FieldDescriptor::enum_type((FieldDescriptor *)in_stack_ffffffffffffff40);
    this_04 = EnumDescriptor::value(this_03,0);
    iVar4 = EnumValueDescriptor::number(this_04);
    if (iVar4 != 0) {
      FieldDescriptor::full_name_abi_cxx11_(in_RSI);
      AddError(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
    }
  }
  return true;
}

Assistant:

bool DescriptorBuilder::ValidateMapEntry(FieldDescriptor* field,
                                         const FieldDescriptorProto& proto) {
  const Descriptor* message = field->message_type();
  if (  // Must not contain extensions, extension range or nested message or
        // enums
      message->extension_count() != 0 ||
      field->label() != FieldDescriptor::LABEL_REPEATED ||
      message->extension_range_count() != 0 ||
      message->nested_type_count() != 0 || message->enum_type_count() != 0 ||
      // Must contain exactly two fields
      message->field_count() != 2 ||
      // Field name and message name must match
      message->name() != ToCamelCase(field->name(), false) + "Entry" ||
      // Entry message must be in the same containing type of the field.
      field->containing_type() != message->containing_type()) {
    return false;
  }

  const FieldDescriptor* key = message->field(0);
  const FieldDescriptor* value = message->field(1);
  if (key->label() != FieldDescriptor::LABEL_OPTIONAL || key->number() != 1 ||
      key->name() != "key") {
    return false;
  }
  if (value->label() != FieldDescriptor::LABEL_OPTIONAL ||
      value->number() != 2 || value->name() != "value") {
    return false;
  }

  // Check key types are legal.
  switch (key->type()) {
    case FieldDescriptor::TYPE_ENUM:
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Key in map fields cannot be enum types.");
      break;
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_BYTES:
      AddError(
          field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
          "Key in map fields cannot be float/double, bytes or message types.");
      break;
    case FieldDescriptor::TYPE_BOOL:
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_SFIXED32:
    case FieldDescriptor::TYPE_SFIXED64:
      // Legal cases
      break;
      // Do not add a default, so that the compiler will complain when new types
      // are added.
  }

  if (value->type() == FieldDescriptor::TYPE_ENUM) {
    if (value->enum_type()->value(0)->number() != 0) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Enum value in map must define 0 as the first value.");
    }
  }

  return true;
}